

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowInstrumentType::~IfcFlowInstrumentType(IfcFlowInstrumentType *this)

{
  ~IfcFlowInstrumentType
            ((IfcFlowInstrumentType *)
             &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x48);
  return;
}

Assistant:

IfcFlowInstrumentType() : Object("IfcFlowInstrumentType") {}